

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.cpp
# Opt level: O0

void duckdb::PadFunction<duckdb::LeftPadOperator>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_class_16_2_52ce5e5c fun;
  Vector *in_RDX;
  DataChunk *in_RDI;
  vector<char,_true> buffer;
  value_type *pad_vector;
  value_type *len_vector;
  value_type *str_vector;
  size_type in_stack_ffffffffffffff58;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffff60;
  reference count;
  reference result_00;
  reference c;
  Vector *b;
  Vector *a;
  Vector *in_stack_ffffffffffffffa0;
  Vector local_48 [24];
  reference local_30;
  reference local_28;
  reference local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_28 = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_30 = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  a = local_48;
  vector<char,_true>::vector((vector<char,_true> *)0xe986f8);
  count = local_20;
  result_00 = local_28;
  c = local_30;
  b = local_18;
  DataChunk::size(local_8);
  fun.buffer = (vector<char,_true> *)local_18;
  fun.result = in_stack_ffffffffffffffa0;
  TernaryExecutor::
  Execute<duckdb::string_t,int,duckdb::string_t,duckdb::string_t,duckdb::PadFunction<duckdb::LeftPadOperator>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int,duckdb::string_t)_1_>
            (a,b,c,result_00,(idx_t)count,fun);
  vector<char,_true>::~vector((vector<char,_true> *)0xe98780);
  return;
}

Assistant:

static void PadFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vector = args.data[0];
	auto &len_vector = args.data[1];
	auto &pad_vector = args.data[2];

	vector<char> buffer;
	TernaryExecutor::Execute<string_t, int32_t, string_t, string_t>(
	    str_vector, len_vector, pad_vector, result, args.size(), [&](string_t str, int32_t len, string_t pad) {
		    len = MaxValue<int32_t>(len, 0);
		    return StringVector::AddString(result, OP::Operation(str, len, pad, buffer));
	    });
}